

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall duckdb_re2::Compiler::EmptyWidth(Compiler *this,EmptyOp empty)

{
  long lVar1;
  Frag FVar2;
  ulong uVar3;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  int iStack_34;
  
  local_40 = AllocInst(this,1);
  if ((int)local_40 < 0) {
    local_40 = 0;
    lVar1 = 0;
    iStack_34 = (uint)iStack_34._1_3_ << 8;
  }
  else {
    uVar3 = (ulong)local_40;
    Prog::Inst::InitEmptyWidth
              ((this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar3,empty,0)
    ;
    lVar1 = (uVar3 << 0x21) + uVar3 * 2;
    iStack_34 = CONCAT31(iStack_34._1_3_,1);
  }
  uStack_38 = (undefined4)((ulong)lVar1 >> 0x20);
  uStack_3c = (undefined4)lVar1;
  FVar2.end.head = uStack_3c;
  FVar2.begin = local_40;
  FVar2.end.tail = uStack_38;
  FVar2._12_4_ = iStack_34;
  return FVar2;
}

Assistant:

Frag Compiler::EmptyWidth(EmptyOp empty) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitEmptyWidth(empty, 0);
  return Frag(id, PatchList::Mk(id << 1), true);
}